

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rand.cpp
# Opt level: O3

void __thiscall crnlib::random::seed(random *this,uint32 i1,uint32 i2,uint32 i3)

{
  uint32 uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  uVar6 = i2 ^ i1 ^ i3;
  iVar5 = 0x14;
  uVar7 = uVar6;
  uVar8 = uVar6;
  uVar2 = 0xf1ea5eed;
  do {
    uVar1 = uVar8 + uVar6;
    uVar3 = (uVar6 << 0x11 | uVar6 >> 0xf) ^ uVar7;
    iVar4 = uVar2 - (uVar7 << 0x1b | uVar7 >> 5);
    uVar6 = uVar8 + iVar4;
    uVar8 = iVar4 + uVar3;
    iVar5 = iVar5 + -1;
    uVar7 = uVar1;
    uVar2 = uVar3;
  } while (iVar5 != 0);
  (this->m_ranctx).a = uVar3;
  (this->m_ranctx).b = uVar1;
  (this->m_ranctx).c = uVar6;
  (this->m_ranctx).d = uVar8;
  (this->m_kiss99).x = i1;
  (this->m_kiss99).y = i2;
  (this->m_kiss99).z = i3;
  (this->m_kiss99).c = 0x74cbb1;
  well512::seed(&this->m_well512,i1,i2,i3);
  iVar5 = 100;
  do {
    urand32(this);
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  return;
}

Assistant:

void random::seed(uint32 i1, uint32 i2, uint32 i3)
    {
        m_ranctx.seed(i1 ^ i2 ^ i3);

        m_kiss99.seed(i1, i2, i3);

        m_well512.seed(i1, i2, i3);

        for (uint i = 0; i < 100; i++)
        {
            urand32();
        }
    }